

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall gl4cts::ShaderSubroutine::Utils::framebuffer::~framebuffer(framebuffer *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  if (this->m_id != 0) {
    iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x440))(1,this);
    this->m_id = 0;
  }
  return;
}

Assistant:

Utils::framebuffer::~framebuffer()
{
	if (0 != m_id)
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.deleteFramebuffers(1, &m_id);
		m_id = 0;
	}
}